

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

bool __thiscall sortfun::operator()(sortfun *this,sortitem *xval,sortitem *yval)

{
  uint *puVar1;
  bool bVar2;
  ident *piVar3;
  
  piVar3 = this->x;
  if ((piVar3->field_2).minval != 6) {
    (piVar3->field_2).minval = 6;
    piVar3 = this->x;
  }
  puVar1 = (piVar3->field_3).code;
  if (puVar1 != (uint *)0x0) {
    *puVar1 = *puVar1 - 0x100;
    if ((int)*(piVar3->field_3).code < 0x100) {
      operator_delete__((piVar3->field_3).code);
    }
    (piVar3->field_3).code = (uint *)0x0;
    piVar3 = this->x;
  }
  piVar3->field_4 = (anon_union_8_3_558327c1_for_ident_6)xval->str;
  piVar3 = this->y;
  if ((piVar3->field_2).minval != 6) {
    (piVar3->field_2).minval = 6;
    piVar3 = this->y;
  }
  puVar1 = (piVar3->field_3).code;
  if (puVar1 != (uint *)0x0) {
    *puVar1 = *puVar1 - 0x100;
    if ((int)*(piVar3->field_3).code < 0x100) {
      operator_delete__((piVar3->field_3).code);
    }
    (piVar3->field_3).code = (uint *)0x0;
    piVar3 = this->y;
  }
  (piVar3->field_4).val.field_0 = (anon_union_8_5_08252708_for_identval_0)yval->str;
  bVar2 = executebool(this->body);
  return bVar2;
}

Assistant:

bool operator()(const sortitem &xval, const sortitem &yval)
    {
        if(x->valtype != VAL_MACRO) x->valtype = VAL_MACRO;
        cleancode(*x);
        x->val.code = (const uint *)xval.str;
        if(y->valtype != VAL_MACRO) y->valtype = VAL_MACRO;
        cleancode(*y);
        y->val.code = (const uint *)yval.str;
        return executebool(body);
    }